

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSubmitCommand.cxx
# Opt level: O2

cmCTestGenericHandler * __thiscall
cmCTestSubmitCommand::InitializeHandler(cmCTestSubmitCommand *this)

{
  cmCTest *pcVar1;
  cmMakefile *pcVar2;
  bool bVar3;
  pointer value;
  char *pcVar4;
  cmCTestSubmitHandler *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  notesFiles;
  allocator<char> local_69;
  undefined1 local_68 [32];
  _Base_ptr local_48;
  size_t local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  
  if ((this->SubmitURL)._M_string_length == 0) {
    pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_68,"CTEST_SUBMIT_URL",(allocator<char> *)&local_38);
    value = cmMakefile::GetDefinition(pcVar2,(string *)local_68);
    std::__cxx11::string::~string((string *)local_68);
  }
  else {
    value = (this->SubmitURL)._M_dataplus._M_p;
  }
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  if (value == (char *)0x0) {
    pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_68,"CTEST_DROP_METHOD",(allocator<char> *)&local_38);
    cmCTest::SetCTestConfigurationFromCMakeVariable
              (pcVar1,pcVar2,"DropMethod",(string *)local_68,
               (this->super_cmCTestHandlerCommand).Quiet);
    std::__cxx11::string::~string((string *)local_68);
    pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_68,"CTEST_DROP_SITE_USER",(allocator<char> *)&local_38);
    cmCTest::SetCTestConfigurationFromCMakeVariable
              (pcVar1,pcVar2,"DropSiteUser",(string *)local_68,
               (this->super_cmCTestHandlerCommand).Quiet);
    std::__cxx11::string::~string((string *)local_68);
    pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_68,"CTEST_DROP_SITE_PASSWORD",(allocator<char> *)&local_38);
    cmCTest::SetCTestConfigurationFromCMakeVariable
              (pcVar1,pcVar2,"DropSitePassword",(string *)local_68,
               (this->super_cmCTestHandlerCommand).Quiet);
    std::__cxx11::string::~string((string *)local_68);
    pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_68,"CTEST_DROP_SITE",(allocator<char> *)&local_38);
    cmCTest::SetCTestConfigurationFromCMakeVariable
              (pcVar1,pcVar2,"DropSite",(string *)local_68,(this->super_cmCTestHandlerCommand).Quiet
              );
    std::__cxx11::string::~string((string *)local_68);
    pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_68,"CTEST_DROP_LOCATION",(allocator<char> *)&local_38);
    cmCTest::SetCTestConfigurationFromCMakeVariable
              (pcVar1,pcVar2,"DropLocation",(string *)local_68,
               (this->super_cmCTestHandlerCommand).Quiet);
    std::__cxx11::string::~string((string *)local_68);
  }
  else {
    cmCTest::SetCTestConfiguration
              (pcVar1,"SubmitURL",value,(this->super_cmCTestHandlerCommand).Quiet);
  }
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_68,"CTEST_CURL_OPTIONS",(allocator<char> *)&local_38);
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar1,pcVar2,"CurlOptions",(string *)local_68,
             (this->super_cmCTestHandlerCommand).Quiet);
  std::__cxx11::string::~string((string *)local_68);
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_68,"CTEST_NOTES_FILES",(allocator<char> *)&local_38);
  pcVar4 = cmMakefile::GetDefinition(pcVar2,(string *)local_68);
  std::__cxx11::string::~string((string *)local_68);
  if (pcVar4 != (char *)0x0) {
    local_38.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_38.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_38.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string<std::allocator<char>>((string *)local_68,pcVar4,&local_69);
    cmSystemTools::ExpandListArgument((string *)local_68,&local_38,false);
    std::__cxx11::string::~string((string *)local_68);
    cmCTest::GenerateNotesFile
              ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,&local_38);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_38);
  }
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_68,"CTEST_EXTRA_SUBMIT_FILES",(allocator<char> *)&local_38);
  pcVar4 = cmMakefile::GetDefinition(pcVar2,(string *)local_68);
  std::__cxx11::string::~string((string *)local_68);
  if (pcVar4 != (char *)0x0) {
    local_38.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_38.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_38.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string<std::allocator<char>>((string *)local_68,pcVar4,&local_69);
    cmSystemTools::ExpandListArgument((string *)local_68,&local_38,false);
    std::__cxx11::string::~string((string *)local_68);
    bVar3 = cmCTest::SubmitExtraFiles
                      ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,&local_38);
    if (!bVar3) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_68,"problem submitting extra files.",&local_69);
      cmCommand::SetError((cmCommand *)this,(string *)local_68);
      std::__cxx11::string::~string((string *)local_68);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_38);
      return (cmCTestGenericHandler *)0x0;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_38);
  }
  this_00 = cmCTest::GetSubmitHandler
                      ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest);
  (*(this_00->super_cmCTestGenericHandler)._vptr_cmCTestGenericHandler[3])(this_00);
  if (this->FilesMentioned == true) {
    local_68._24_8_ = local_68 + 8;
    local_68._0_8_ = (pointer)0x0;
    local_68._8_8_ = 0;
    local_68._16_8_ = 0;
    local_40 = 0;
    local_48 = (_Base_ptr)local_68._24_8_;
    cmCTestSubmitHandler::SelectParts
              (this_00,(set<cmCTest::Part,_std::less<cmCTest::Part>,_std::allocator<cmCTest::Part>_>
                        *)local_68);
    std::
    _Rb_tree<cmCTest::Part,_cmCTest::Part,_std::_Identity<cmCTest::Part>,_std::less<cmCTest::Part>,_std::allocator<cmCTest::Part>_>
    ::~_Rb_tree((_Rb_tree<cmCTest::Part,_cmCTest::Part,_std::_Identity<cmCTest::Part>,_std::less<cmCTest::Part>,_std::allocator<cmCTest::Part>_>
                 *)local_68);
    cmCTestSubmitHandler::SelectFiles(this_00,&this->Files);
  }
  if (this->PartsMentioned == true) {
    cmCTestSubmitHandler::SelectParts(this_00,&this->Parts);
  }
  if ((this->HttpHeaders).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->HttpHeaders).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&this_00->HttpHeaders,&this->HttpHeaders);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_68,"RetryDelay",(allocator<char> *)&local_38);
  cmCTestGenericHandler::SetOption
            (&this_00->super_cmCTestGenericHandler,(string *)local_68,
             (this->RetryDelay)._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_68,"RetryCount",(allocator<char> *)&local_38);
  cmCTestGenericHandler::SetOption
            (&this_00->super_cmCTestGenericHandler,(string *)local_68,
             (this->RetryCount)._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_68,"InternalTest",(allocator<char> *)&local_38);
  pcVar4 = "OFF";
  if (this->InternalTest != false) {
    pcVar4 = "ON";
  }
  cmCTestGenericHandler::SetOption(&this_00->super_cmCTestGenericHandler,(string *)local_68,pcVar4);
  std::__cxx11::string::~string((string *)local_68);
  (this_00->super_cmCTestGenericHandler).Quiet = (this->super_cmCTestHandlerCommand).Quiet;
  if (this->CDashUpload == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_68,"CDashUploadFile",(allocator<char> *)&local_38);
    cmCTestGenericHandler::SetOption
              (&this_00->super_cmCTestGenericHandler,(string *)local_68,
               (this->CDashUploadFile)._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)local_68);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_68,"CDashUploadType",(allocator<char> *)&local_38);
    cmCTestGenericHandler::SetOption
              (&this_00->super_cmCTestGenericHandler,(string *)local_68,
               (this->CDashUploadType)._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)local_68);
  }
  return &this_00->super_cmCTestGenericHandler;
}

Assistant:

cmCTestGenericHandler* cmCTestSubmitCommand::InitializeHandler()
{
  const char* submitURL = !this->SubmitURL.empty()
    ? this->SubmitURL.c_str()
    : this->Makefile->GetDefinition("CTEST_SUBMIT_URL");

  if (submitURL) {
    this->CTest->SetCTestConfiguration("SubmitURL", submitURL, this->Quiet);
  } else {
    this->CTest->SetCTestConfigurationFromCMakeVariable(
      this->Makefile, "DropMethod", "CTEST_DROP_METHOD", this->Quiet);
    this->CTest->SetCTestConfigurationFromCMakeVariable(
      this->Makefile, "DropSiteUser", "CTEST_DROP_SITE_USER", this->Quiet);
    this->CTest->SetCTestConfigurationFromCMakeVariable(
      this->Makefile, "DropSitePassword", "CTEST_DROP_SITE_PASSWORD",
      this->Quiet);
    this->CTest->SetCTestConfigurationFromCMakeVariable(
      this->Makefile, "DropSite", "CTEST_DROP_SITE", this->Quiet);
    this->CTest->SetCTestConfigurationFromCMakeVariable(
      this->Makefile, "DropLocation", "CTEST_DROP_LOCATION", this->Quiet);
  }

  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "CurlOptions", "CTEST_CURL_OPTIONS", this->Quiet);

  const char* notesFilesVariable =
    this->Makefile->GetDefinition("CTEST_NOTES_FILES");
  if (notesFilesVariable) {
    std::vector<std::string> notesFiles;
    cmSystemTools::ExpandListArgument(notesFilesVariable, notesFiles);
    this->CTest->GenerateNotesFile(notesFiles);
  }

  const char* extraFilesVariable =
    this->Makefile->GetDefinition("CTEST_EXTRA_SUBMIT_FILES");
  if (extraFilesVariable) {
    std::vector<std::string> extraFiles;
    cmSystemTools::ExpandListArgument(extraFilesVariable, extraFiles);
    if (!this->CTest->SubmitExtraFiles(extraFiles)) {
      this->SetError("problem submitting extra files.");
      return nullptr;
    }
  }

  cmCTestSubmitHandler* handler = this->CTest->GetSubmitHandler();
  handler->Initialize();

  // If no FILES or PARTS given, *all* PARTS are submitted by default.
  //
  // If FILES are given, but not PARTS, only the FILES are submitted
  // and *no* PARTS are submitted.
  //  (This is why we select the empty "noParts" set in the
  //   FilesMentioned block below...)
  //
  // If PARTS are given, only the selected PARTS are submitted.
  //
  // If both PARTS and FILES are given, only the selected PARTS *and*
  // all the given FILES are submitted.

  // If given explicit FILES to submit, pass them to the handler.
  //
  if (this->FilesMentioned) {
    // Intentionally select *no* PARTS. (Pass an empty set.) If PARTS
    // were also explicitly mentioned, they will be selected below...
    // But FILES with no PARTS mentioned should just submit the FILES
    // without any of the default parts.
    //
    handler->SelectParts(std::set<cmCTest::Part>());
    handler->SelectFiles(this->Files);
  }

  // If a PARTS option was given, select only the named parts for submission.
  //
  if (this->PartsMentioned) {
    handler->SelectParts(this->Parts);
  }

  // Pass along any HTTPHEADER to the handler if this option was given.
  if (!this->HttpHeaders.empty()) {
    handler->SetHttpHeaders(this->HttpHeaders);
  }

  handler->SetOption("RetryDelay", this->RetryDelay.c_str());
  handler->SetOption("RetryCount", this->RetryCount.c_str());
  handler->SetOption("InternalTest", this->InternalTest ? "ON" : "OFF");

  handler->SetQuiet(this->Quiet);

  if (this->CDashUpload) {
    handler->SetOption("CDashUploadFile", this->CDashUploadFile.c_str());
    handler->SetOption("CDashUploadType", this->CDashUploadType.c_str());
  }
  return handler;
}